

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O3

int CVDiagSetup(CVodeMem cv_mem,int convfail,N_Vector ypred,N_Vector fpred,int *jcurPtr,
               N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  double dVar1;
  sunrealtype *psVar2;
  int iVar3;
  sunrealtype sVar4;
  int iVar5;
  
  psVar2 = (sunrealtype *)cv_mem->cv_lmem;
  dVar1 = cv_mem->cv_rl1;
  N_VLinearSum(cv_mem->cv_h,0xbff0000000000000,fpred,cv_mem->cv_zn[1],vtemp1);
  N_VLinearSum(dVar1 * 0.1,0x3ff0000000000000,vtemp1,ypred,vtemp2);
  iVar3 = (*cv_mem->cv_f)(cv_mem->cv_tn,vtemp2,(N_Vector)psVar2[1],cv_mem->cv_user_data);
  psVar2[4] = (sunrealtype)((long)psVar2[4] + 1);
  if (iVar3 < 0) {
    cvProcessError(cv_mem,-6,0x164,"CVDiagSetup",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                   ,"The right-hand side routine failed in an unrecoverable manner.");
    iVar5 = -1;
    sVar4 = -NAN;
  }
  else {
    iVar5 = 1;
    sVar4 = -NAN;
    if (iVar3 == 0) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,psVar2[1],fpred,psVar2[1]);
      N_VLinearSum(0x3fb999999999999a,-cv_mem->cv_h,vtemp1,psVar2[1]);
      N_VProd(vtemp1,cv_mem->cv_ewt,vtemp2);
      N_VCompare(cv_mem->cv_uround,vtemp2,psVar2[2]);
      N_VAddConst(0xbff0000000000000,psVar2[2],psVar2[3]);
      N_VProd(vtemp1,psVar2[2],vtemp2);
      N_VLinearSum(0x3fb999999999999a,0xbff0000000000000,vtemp2,psVar2[3],vtemp2);
      N_VDiv(psVar2[1],vtemp2,psVar2[1]);
      N_VProd(psVar2[1],psVar2[2],psVar2[1]);
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,psVar2[1],psVar2[3],psVar2[1]);
      iVar3 = N_VInvTest(psVar2[1],psVar2[1]);
      if (iVar3 == 0) {
        sVar4 = -NAN;
      }
      else {
        *jcurPtr = 1;
        *psVar2 = cv_mem->cv_gamma;
        sVar4 = 0.0;
        iVar5 = 0;
      }
    }
  }
  psVar2[5] = sVar4;
  return iVar5;
}

Assistant:

static int CVDiagSetup(CVodeMem cv_mem, SUNDIALS_MAYBE_UNUSED int convfail,
                       N_Vector ypred, N_Vector fpred, sunbooleantype* jcurPtr,
                       N_Vector vtemp1, N_Vector vtemp2,
                       SUNDIALS_MAYBE_UNUSED N_Vector vtemp3)
{
  sunrealtype r;
  N_Vector ftemp, y;
  sunbooleantype invOK;
  CVDiagMem cvdiag_mem;
  int retval;

  cvdiag_mem = (CVDiagMem)lmem;

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = vtemp1;
  y     = vtemp2;

  /* Form y with perturbation = FRACT*(func. iter. correction) */
  r = FRACT * rl1;
  N_VLinearSum(h, fpred, -ONE, zn[1], ftemp);
  N_VLinearSum(r, ftemp, ONE, ypred, y);

  /* Evaluate f at perturbed y */
  retval = f(tn, y, M, cv_mem->cv_user_data);
  nfeDI++;
  if (retval < 0)
  {
    cvProcessError(cv_mem, CVDIAG_RHSFUNC_UNRECVR, __LINE__, __func__, __FILE__,
                   MSGDG_RHSFUNC_FAILED);
    last_flag = CVDIAG_RHSFUNC_UNRECVR;
    return (-1);
  }
  if (retval > 0)
  {
    last_flag = CVDIAG_RHSFUNC_RECVR;
    return (1);
  }

  /* Construct M = I - gamma*J with J = diag(deltaf_i/deltay_i) */
  N_VLinearSum(ONE, M, -ONE, fpred, M);
  N_VLinearSum(FRACT, ftemp, -h, M, M);
  N_VProd(ftemp, ewt, y);
  /* Protect against deltay_i being at roundoff level */
  N_VCompare(uround, y, bit);
  N_VAddConst(bit, -ONE, bitcomp);
  N_VProd(ftemp, bit, y);
  N_VLinearSum(FRACT, y, -ONE, bitcomp, y);
  N_VDiv(M, y, M);
  N_VProd(M, bit, M);
  N_VLinearSum(ONE, M, -ONE, bitcomp, M);

  /* Invert M with test for zero components */
  invOK = N_VInvTest(M, M);
  if (!invOK)
  {
    last_flag = CVDIAG_INV_FAIL;
    return (1);
  }

  /* Set jcur = SUNTRUE, save gamma in gammasv, and return */
  *jcurPtr  = SUNTRUE;
  gammasv   = gamma;
  last_flag = CVDIAG_SUCCESS;
  return (0);
}